

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O0

void __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::PartitionOptimizerBase
          (PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
           *this,Data *data,Solution *initialSolution)

{
  size_t sVar1;
  size_t __n;
  reference pvVar2;
  ProblemGraph *pPVar3;
  reference pvVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  Data *in_RSI;
  HeuristicBase *in_RDI;
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  *unaff_retaddr;
  size_t v1;
  size_t v0;
  size_t edge;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_000000a0;
  Data *in_stack_000000a8;
  HeuristicBase *in_stack_00000380;
  size_t in_stack_ffffffffffffff38;
  ProblemGraph *in_stack_ffffffffffffff40;
  allocator_type *in_stack_ffffffffffffff48;
  value_type vVar5;
  bool *in_stack_ffffffffffffff50;
  size_type sVar6;
  size_type in_stack_ffffffffffffff58;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff60;
  HeuristicBase *this_00;
  size_type local_38;
  
  HeuristicBase::HeuristicBase(in_RDI,in_RSI);
  in_RDI->_vptr_HeuristicBase = (_func_int **)&PTR_optimize_00206800;
  this_00 = in_RDI + 1;
  PartitionGraph::PartitionGraph<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((PartitionGraph *)initialSolution,in_stack_000000a8,in_stack_000000a0);
  in_RDI[8].data_ = (Data *)0x0;
  *(undefined8 *)&in_RDI[8].silent_ = 0;
  in_RDI[9]._vptr_HeuristicBase = (_func_int **)0x0;
  in_RDI[9].data_ = (Data *)0x0;
  ProblemGraph::graph(in_RSI->problemGraph);
  andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
            ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1be19c);
  std::allocator<bool>::allocator((allocator<bool> *)0x1be1bb);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  std::allocator<bool>::~allocator((allocator<bool> *)0x1be1e6);
  ProblemGraph::graph(in_RSI->problemGraph);
  andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
            ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1be20e);
  std::allocator<bool>::allocator((allocator<bool> *)0x1be22d);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  std::allocator<bool>::~allocator((allocator<bool> *)0x1be258);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x1be26e);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x1be284);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,in_RDX);
  local_38 = 0;
  while( true ) {
    sVar6 = local_38;
    ProblemGraph::graph(in_RDI->data_->problemGraph);
    sVar1 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfEdges
                      ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1be2d8);
    if (sVar1 <= sVar6) break;
    ProblemGraph::graph(in_RDI->data_->problemGraph);
    sVar1 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
                      ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                       in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x1be30e);
    ProblemGraph::graph(in_RDI->data_->problemGraph);
    __n = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::vertexOfEdge
                    ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                     in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x1be33f);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RDI[7].data_,
                        sVar1);
    vVar5 = *pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&in_RDI[7].data_,
                        __n);
    if (vVar5 != *pvVar2) {
      in_stack_ffffffffffffff40 =
           (ProblemGraph *)
           ProblemGraph::frameOfNode(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      pPVar3 = (ProblemGraph *)
               ProblemGraph::frameOfNode(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if (in_stack_ffffffffffffff40 == pPVar3) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->data_->costs,local_38);
        in_RDI[8].data_ = (Data *)(*pvVar4 + (double)in_RDI[8].data_);
      }
      else {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->data_->costs,local_38);
        in_RDI[9]._vptr_HeuristicBase =
             (_func_int **)(*pvVar4 + (double)in_RDI[9]._vptr_HeuristicBase);
      }
    }
    local_38 = local_38 + 1;
  }
  solveFullBranchingProblemAndUpdateLabels(unaff_retaddr);
  HeuristicBase::logObj(in_stack_00000380);
  return;
}

Assistant:

PartitionOptimizerBase(Data& data, Solution initialSolution)
      : HeuristicBase(data)
      , partitionGraph_(data, initialSolution.edge_labels)
      , swapped_(data.problemGraph.graph().numberOfVertices(), false)
      , visited_(data.problemGraph.graph().numberOfVertices(), false)
      , bestVertexLabels_(partitionGraph_.vertexLabels_)
    {
        // initialize internal objective.
        for (size_t edge = 0;
             edge < this->data_.problemGraph.graph().numberOfEdges(); ++edge) {
            const auto v0 =
                this->data_.problemGraph.graph().vertexOfEdge(edge, 0);
            const auto v1 =
                this->data_.problemGraph.graph().vertexOfEdge(edge, 1);

            if (partitionGraph_.vertexLabels_[v0] ==
                partitionGraph_.vertexLabels_[v1]) {
                continue;
            }

            if (this->data_.problemGraph.frameOfNode(v0) ==
                this->data_.problemGraph.frameOfNode(v1)) {
                internalObjective_ += this->data_.costs[edge];
            } else {
                totalBranching_ += this->data_.costs[edge];
            }
        }

        // optimal branching for initial partitioning.
        solveFullBranchingProblemAndUpdateLabels();

        this->logObj();
    }